

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTHumidityHTU21D.cpp
# Opt level: O3

bool __thiscall RTHumidityHTU21D::humidityInit(RTHumidityHTU21D *this)

{
  uchar slaveAddr;
  RTIMUSettings *this_00;
  bool bVar1;
  uint64_t uVar2;
  
  this_00 = (this->super_RTHumidity).m_settings;
  slaveAddr = this_00->m_I2CHumidityAddress;
  this->m_humidityAddr = slaveAddr;
  bVar1 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,slaveAddr,0xfe,'\0',(uchar *)0x0,
                             "Failed to reset HTU21D");
  if (bVar1) {
    this->m_state = 0;
    uVar2 = RTMath::currentUSecsSinceEpoch();
    this->m_startTime = uVar2;
  }
  return bVar1;
}

Assistant:

bool RTHumidityHTU21D::humidityInit()
{
    m_humidityAddr = m_settings->m_I2CHumidityAddress;

    if (!m_settings->HALWrite(m_humidityAddr, HTU21D_CMD_SOFT_RESET, 0, NULL, "Failed to reset HTU21D"))
        return false;

    m_state = HTU21D_STATE_IN_RESET;
    m_startTime = RTMath::currentUSecsSinceEpoch();
    return true;
}